

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  ~IfcBuildingElementProxy((IfcBuildingElementProxy *)&this[-1].field_0x60);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}